

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void RunLoadStorePropagation(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  VmType *pVVar1;
  VmBlock *pVVar2;
  VariableData *pVVar3;
  VmValue *pVVar4;
  VmValue *pVVar5;
  VmType type;
  VmType type_00;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  VmInstructionType VVar10;
  VmFunction *pVVar11;
  VariableData **ppVVar12;
  VmConstant **ppVVar13;
  VmValue **ppVVar14;
  VmInstruction *pVVar15;
  VmInstruction **ppVVar16;
  VmConstant *pVVar17;
  VmConstant *pVVar18;
  VmConstant *this;
  VmConstant *pVVar19;
  VmValue *pVVar20;
  VmValue *in_R9;
  byte local_471;
  byte local_461;
  VmValue *storeValue;
  VmConstant *storeOffset;
  VmValue *storePointer;
  VmInstruction *prev_1;
  VmConstant *loadAddress;
  VmConstant *loadOffset_1;
  VmValue *loadPointer_1;
  VmInstruction *next_2;
  VmInstruction *curr_3;
  VmConstant *currOffset;
  VmConstant *currAddressAsConst;
  VmConstant *prevOffset;
  VmConstant *prevAddressAsConst;
  VmInstruction *pVStack_2e8;
  bool same;
  VmInstruction *prev;
  VmInstruction *curr_2;
  VmValue *prevValue_3;
  uint accessSize;
  uint loadSize;
  VmConstant *loadInst;
  VmConstant *loadOffset;
  VmValue *loadPointer;
  VmConstant *local_2a0;
  VmConstant *reference_1;
  VmConstant *constAddress_1;
  VmInstruction *prevCopy_2;
  VmConstant *constant_4;
  VmConstant *constant_3;
  TypeBase *local_270;
  VmConstant *local_268;
  VmConstant *reference;
  VmConstant *constAddress;
  VmInstruction *prevCopy_1;
  VmConstant *constant_2;
  VmFunction *pVStack_240;
  uint i_1;
  VmFunction *targetFunction;
  VmInstruction *pVStack_230;
  uint firstArgument;
  VmInstruction *prevCopy;
  VmConstant *offset;
  VmValue *address;
  TypeBase *local_210;
  VmValue *local_208;
  VmValue *prevValue_2;
  VmConstant *constant_1;
  VmValue *prevValue_1;
  VmConstant *constant;
  VmValue *prevValue;
  VmInstruction *next_1;
  VmInstruction *curr_1;
  VmBlock *block;
  VmInstruction *inst_2;
  VmInstruction *pVStack_1b8;
  uint k_2;
  VmInstruction *inst_1;
  VmConstant *pVStack_1a8;
  uint l_1;
  VmConstant *user_1;
  uint local_18c;
  undefined1 local_188 [4];
  uint k_1;
  SmallArray<VmInstruction_*,_32U> deadStores;
  VmConstant *dst;
  VmInstruction *inst;
  uint l;
  VmConstant *user;
  uint k;
  bool nonStoreUse;
  VariableData *variable;
  uint i;
  VmBlock *next;
  VmBlock *curr;
  VmFunction *function;
  VmValue *value_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pVVar11 = getType<VmFunction>(value);
  if (pVVar11 == (VmFunction *)0x0) {
    curr_1 = (VmInstruction *)getType<VmBlock>(value);
    if ((VmBlock *)curr_1 != (VmBlock *)0x0) {
      anon_unknown.dwarf_aa461::ClearLoadStoreInfo(module);
      next_1 = (VmInstruction *)(curr_1->arguments).little[3];
      while (next_1 != (VmInstruction *)0x0) {
        prevValue = &next_1->nextSibling->super_VmValue;
        switch(next_1->cmd) {
        case VM_INST_LOAD_BYTE:
          constant = (VmConstant *)anon_unknown.dwarf_aa461::GetLoadStoreInfo(module,next_1);
          if ((constant == (VmConstant *)0x0) ||
             (prevValue_1 = &getType<VmConstant>((VmValue *)constant)->super_VmValue,
             pVVar15 = next_1, (VmConstant *)prevValue_1 == (VmConstant *)0x0)) {
            anon_unknown.dwarf_aa461::AddLoadInfo(module,next_1);
          }
          else {
            pVVar17 = CreateConstantInt(module->allocator,(constant->super_VmValue).source,
                                        (int)(char)((VmConstant *)prevValue_1)->iValue);
            anon_unknown.dwarf_aa461::ReplaceValueUsersWith
                      (module,&pVVar15->super_VmValue,&pVVar17->super_VmValue,
                       &module->loadStorePropagations);
          }
          break;
        case VM_INST_LOAD_SHORT:
          constant_1 = (VmConstant *)anon_unknown.dwarf_aa461::GetLoadStoreInfo(module,next_1);
          if ((constant_1 == (VmConstant *)0x0) ||
             (prevValue_2 = &getType<VmConstant>((VmValue *)constant_1)->super_VmValue,
             pVVar15 = next_1, (VmConstant *)prevValue_2 == (VmConstant *)0x0)) {
            anon_unknown.dwarf_aa461::AddLoadInfo(module,next_1);
          }
          else {
            pVVar17 = CreateConstantInt(module->allocator,(constant_1->super_VmValue).source,
                                        (int)(short)((VmConstant *)prevValue_2)->iValue);
            anon_unknown.dwarf_aa461::ReplaceValueUsersWith
                      (module,&pVVar15->super_VmValue,&pVVar17->super_VmValue,
                       &module->loadStorePropagations);
          }
          break;
        case VM_INST_LOAD_INT:
        case VM_INST_LOAD_FLOAT:
        case VM_INST_LOAD_DOUBLE:
        case VM_INST_LOAD_LONG:
        case VM_INST_LOAD_STRUCT:
          local_208 = anon_unknown.dwarf_aa461::GetLoadStoreInfo(module,next_1);
          if (local_208 == (VmValue *)0x0) {
            anon_unknown.dwarf_aa461::AddLoadInfo(module,next_1);
          }
          else {
            bVar6 = VmType::operator!=(&(next_1->super_VmValue).type,&local_208->type);
            if (bVar6) {
              if ((next_1->super_VmValue).type.size != (local_208->type).size) {
                __assert_fail("curr->type.size == prevValue->type.size",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,0x14f9,
                              "void RunLoadStorePropagation(ExpressionContext &, VmModule *, VmValue *)"
                             );
              }
              module->currentBlock = (VmBlock *)curr_1;
              curr_1->parent = (VmBlock *)next_1->prevSibling;
              address = *(VmValue **)&(next_1->super_VmValue).type;
              local_210 = (next_1->super_VmValue).type.structType;
              type_00.structType = (TypeBase *)local_208;
              type_00._0_8_ = local_210;
              local_208 = anon_unknown.dwarf_aa461::CreateBitcast
                                    ((anon_unknown_dwarf_aa461 *)module,
                                     (VmModule *)(next_1->super_VmValue).source,(SynBase *)address,
                                     type_00,in_R9);
              curr_1->parent = (VmBlock *)(curr_1->arguments).allocator;
              module->currentBlock = (VmBlock *)0x0;
              anon_unknown.dwarf_aa461::ReplaceValueUsersWith
                        (module,&next_1->super_VmValue,local_208,&module->loadStorePropagations);
            }
            else {
              anon_unknown.dwarf_aa461::ReplaceValueUsersWith
                        (module,&next_1->super_VmValue,local_208,&module->loadStorePropagations);
            }
          }
          break;
        default:
          break;
        case VM_INST_STORE_BYTE:
        case VM_INST_STORE_SHORT:
        case VM_INST_STORE_INT:
        case VM_INST_STORE_FLOAT:
        case VM_INST_STORE_DOUBLE:
        case VM_INST_STORE_LONG:
        case VM_INST_STORE_STRUCT:
          anon_unknown.dwarf_aa461::AddStoreInfo(module,next_1);
          break;
        case VM_INST_SET_RANGE:
          anon_unknown.dwarf_aa461::ClearLoadStoreInfoAliasing(module,(VmInstruction *)0x0);
          anon_unknown.dwarf_aa461::ClearLoadStoreInfoGlobal(module);
          break;
        case VM_INST_MEM_COPY:
          ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&next_1->arguments,2);
          offset = (VmConstant *)*ppVVar14;
          ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&next_1->arguments,3);
          pVVar15 = (VmInstruction *)getType<VmConstant>(*ppVVar14);
          pVVar17 = offset;
          prevCopy = pVVar15;
          uVar8 = GetAccessSize(next_1);
          pVStack_230 = anon_unknown.dwarf_aa461::GetCopyInfo
                                  (module,&pVVar17->super_VmValue,(VmConstant *)pVVar15,uVar8);
          pVVar15 = next_1;
          if (pVStack_230 != (VmInstruction *)0x0) {
            VVar10 = next_1->cmd;
            ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&next_1->arguments,0);
            pVVar20 = *ppVVar14;
            ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&next_1->arguments,1);
            pVVar4 = *ppVVar14;
            ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&pVStack_230->arguments,2);
            in_R9 = *ppVVar14;
            ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&pVStack_230->arguments,3);
            pVVar5 = *ppVVar14;
            ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&next_1->arguments,4);
            anon_unknown.dwarf_aa461::ChangeInstructionTo
                      (module,pVVar15,VVar10,pVVar20,pVVar4,in_R9,pVVar5,*ppVVar14,
                       &module->loadStorePropagations);
          }
          anon_unknown.dwarf_aa461::AddCopyInfo(module,next_1);
          break;
        case VM_INST_CALL:
          ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&next_1->arguments,0);
          if (((*ppVVar14)->type).type == VM_TYPE_FUNCTION_REF) {
            targetFunction._4_4_ = 2;
            pVStack_240 = (VmFunction *)0x0;
          }
          else {
            targetFunction._4_4_ = 3;
            ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&next_1->arguments,1);
            pVStack_240 = getType<VmFunction>(*ppVVar14);
          }
          for (constant_2._4_4_ = targetFunction._4_4_; uVar8 = constant_2._4_4_,
              uVar9 = SmallArray<VmValue_*,_4U>::size(&next_1->arguments), uVar8 < uVar9;
              constant_2._4_4_ = constant_2._4_4_ + 1) {
            ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&next_1->arguments,constant_2._4_4_);
            prevCopy_1 = (VmInstruction *)getType<VmConstant>(*ppVVar14);
            if (((prevCopy_1 != (VmInstruction *)0x0) &&
                (((ulong)(prevCopy_1->arguments).allocator & 0x100) != 0)) &&
               (constAddress = (VmConstant *)
                               anon_unknown.dwarf_aa461::GetCopyInfo
                                         (module,(VmValue *)prevCopy_1,(VmConstant *)0x0,
                                          (prevCopy_1->super_VmValue).type.size),
               (VmInstruction *)constAddress != (VmInstruction *)0x0)) {
              ppVVar14 = SmallArray<VmValue_*,_4U>::operator[]
                                   (&((VmInstruction *)constAddress)->arguments,2);
              reference = getType<VmConstant>(*ppVVar14);
              if (reference != (VmConstant *)0x0) {
                pVVar17 = VmModule::get<VmConstant>(module);
                pVVar1 = &(prevCopy_1->super_VmValue).type;
                constant_3 = *(VmConstant **)pVVar1;
                local_270 = (prevCopy_1->super_VmValue).type.structType;
                VmConstant::VmConstant
                          (pVVar17,ctx->allocator,*pVVar1,(next_1->super_VmValue).source);
                pVVar17->iValue = reference->iValue;
                pVVar17->container = reference->container;
                pVVar17->isReference = true;
                local_268 = pVVar17;
                SmallArray<VmConstant_*,_8U>::push_back(&pVVar17->container->users,&local_268);
                (local_268->super_VmValue).comment.begin = (prevCopy_1->super_VmValue).comment.begin
                ;
                (local_268->super_VmValue).comment.end = (prevCopy_1->super_VmValue).comment.end;
                VmValue::AddUse(&local_268->super_VmValue,&next_1->super_VmValue);
                ppVVar14 = SmallArray<VmValue_*,_4U>::operator[]
                                     (&next_1->arguments,constant_2._4_4_);
                VmValue::RemoveUse(*ppVVar14,&next_1->super_VmValue);
                pVVar17 = local_268;
                ppVVar14 = SmallArray<VmValue_*,_4U>::operator[]
                                     (&next_1->arguments,constant_2._4_4_);
                *ppVVar14 = &pVVar17->super_VmValue;
              }
            }
          }
          ppVVar14 = SmallArray<VmValue_*,_4U>::operator[]
                               (&next_1->arguments,targetFunction._4_4_ - 1);
          constant_4 = getType<VmConstant>(*ppVVar14);
          if ((constant_4 != (VmConstant *)0x0) && ((constant_4->isReference & 1U) != 0)) {
            anon_unknown.dwarf_aa461::ClearLoadStoreInfo
                      (module,constant_4->container,constant_4->iValue,
                       (constant_4->super_VmValue).type.size);
          }
          if ((pVStack_240 == (VmFunction *)0x0) || ((pVStack_240->function->attributes & 1) == 0))
          {
            anon_unknown.dwarf_aa461::ClearLoadStoreInfoAliasing(module,(VmInstruction *)0x0);
            anon_unknown.dwarf_aa461::ClearLoadStoreInfoGlobal(module);
          }
          break;
        case VM_INST_RETURN:
          bVar6 = SmallArray<VmValue_*,_4U>::empty(&next_1->arguments);
          if (!bVar6) {
            ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&next_1->arguments,0);
            prevCopy_2 = (VmInstruction *)getType<VmConstant>(*ppVVar14);
            if (((prevCopy_2 != (VmInstruction *)0x0) &&
                (((ulong)(prevCopy_2->arguments).allocator & 0x100) != 0)) &&
               (constAddress_1 =
                     (VmConstant *)
                     anon_unknown.dwarf_aa461::GetCopyInfo
                               (module,(VmValue *)prevCopy_2,(VmConstant *)0x0,
                                (prevCopy_2->super_VmValue).type.size),
               (VmInstruction *)constAddress_1 != (VmInstruction *)0x0)) {
              ppVVar14 = SmallArray<VmValue_*,_4U>::operator[]
                                   (&((VmInstruction *)constAddress_1)->arguments,2);
              reference_1 = getType<VmConstant>(*ppVVar14);
              if (reference_1 != (VmConstant *)0x0) {
                pVVar17 = VmModule::get<VmConstant>(module);
                VmConstant::VmConstant
                          (pVVar17,ctx->allocator,(prevCopy_2->super_VmValue).type,
                           (next_1->super_VmValue).source);
                pVVar17->iValue = reference_1->iValue;
                pVVar17->container = reference_1->container;
                pVVar17->isReference = true;
                local_2a0 = pVVar17;
                SmallArray<VmConstant_*,_8U>::push_back(&pVVar17->container->users,&local_2a0);
                in_R9 = (VmValue *)0x0;
                anon_unknown.dwarf_aa461::ChangeInstructionTo
                          (module,next_1,next_1->cmd,&local_2a0->super_VmValue,(VmValue *)0x0,
                           (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                           &module->loadStorePropagations);
              }
            }
          }
          break;
        case VM_INST_ADD_LOAD:
        case VM_INST_SUB_LOAD:
        case VM_INST_MUL_LOAD:
        case VM_INST_DIV_LOAD:
        case VM_INST_POW_LOAD:
        case VM_INST_MOD_LOAD:
        case VM_INST_LESS_LOAD:
        case VM_INST_GREATER_LOAD:
        case VM_INST_LESS_EQUAL_LOAD:
        case VM_INST_GREATER_EQUAL_LOAD:
        case VM_INST_EQUAL_LOAD:
        case VM_INST_NOT_EQUAL_LOAD:
        case VM_INST_SHL_LOAD:
        case VM_INST_SHR_LOAD:
        case VM_INST_BIT_AND_LOAD:
        case VM_INST_BIT_OR_LOAD:
        case VM_INST_BIT_XOR_LOAD:
          ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&next_1->arguments,1);
          pVVar20 = *ppVVar14;
          ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&next_1->arguments,2);
          pVVar17 = getType<VmConstant>(*ppVVar14);
          ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&next_1->arguments,3);
          pVVar18 = getType<VmConstant>(*ppVVar14);
          prevValue_3._4_4_ = 0;
          if (pVVar18->iValue - 2U < 2) {
            prevValue_3._4_4_ = 4;
          }
          else if (pVVar18->iValue - 4U < 2) {
            prevValue_3._4_4_ = 8;
          }
          if (prevValue_3._4_4_ == 0) {
            __assert_fail("loadSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x15aa,
                          "void RunLoadStorePropagation(ExpressionContext &, VmModule *, VmValue *)"
                         );
          }
          uVar8 = GetAccessSize(next_1);
          in_R9 = (VmValue *)(ulong)(uint)pVVar18->iValue;
          pVVar20 = anon_unknown.dwarf_aa461::GetLoadStoreInfo
                              (module,pVVar20,pVVar17,prevValue_3._4_4_,uVar8,pVVar18->iValue);
          pVVar15 = next_1;
          if (pVVar20 != (VmValue *)0x0) {
            VVar10 = anon_unknown.dwarf_aa461::GetOperationWithoutLoad(next_1->cmd);
            ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&next_1->arguments,0);
            in_R9 = (VmValue *)0x0;
            anon_unknown.dwarf_aa461::ChangeInstructionTo
                      (module,pVVar15,VVar10,*ppVVar14,pVVar20,(VmValue *)0x0,(VmValue *)0x0,
                       (VmValue *)0x0,&module->loadStorePropagations);
          }
        }
        next_1 = (VmInstruction *)prevValue;
      }
      for (prev = (VmInstruction *)(curr_1->arguments).little[3]; prev != (VmInstruction *)0x0;
          prev = prev->nextSibling) {
        if ((7 < (int)prev->cmd) && ((int)prev->cmd < 0xf)) {
          pVStack_2e8 = prev->prevSibling;
          while( true ) {
            local_461 = 0;
            if (pVStack_2e8 != (VmInstruction *)0x0) {
              bVar6 = anon_unknown.dwarf_aa461::HasMemoryAccess(pVStack_2e8->cmd);
              local_461 = bVar6 ^ 0xff;
            }
            if ((local_461 & 1) == 0) break;
            pVStack_2e8 = pVStack_2e8->prevSibling;
          }
          if ((pVStack_2e8 != (VmInstruction *)0x0) && (pVStack_2e8->cmd == prev->cmd)) {
            ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&pVStack_2e8->arguments,0);
            pVVar17 = getType<VmConstant>(*ppVVar14);
            ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&pVStack_2e8->arguments,1);
            pVVar18 = getType<VmConstant>(*ppVVar14);
            ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&prev->arguments,0);
            this = getType<VmConstant>(*ppVVar14);
            ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&prev->arguments,1);
            pVVar19 = getType<VmConstant>(*ppVVar14);
            if ((this == (VmConstant *)0x0) || (pVVar17 == (VmConstant *)0x0)) {
              ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&pVStack_2e8->arguments,0);
              pVVar20 = *ppVVar14;
              ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&prev->arguments,0);
              bVar6 = false;
              if (pVVar20 == *ppVVar14) {
                bVar6 = pVVar18->iValue == pVVar19->iValue;
              }
            }
            else {
              bVar7 = VmConstant::operator==(this,pVVar17);
              bVar6 = false;
              if (bVar7) {
                bVar6 = pVVar18->iValue == pVVar19->iValue;
              }
            }
            if (bVar6) {
              VmBlock::RemoveInstruction((VmBlock *)curr_1,pVStack_2e8);
              module->loadStorePropagations = module->loadStorePropagations + 1;
            }
          }
        }
      }
      pVVar15 = (VmInstruction *)(curr_1->arguments).little[3];
      while (next_2 = pVVar15, next_2 != (VmInstruction *)0x0) {
        pVVar15 = next_2->nextSibling;
        if ((1 < (int)next_2->cmd) && ((int)next_2->cmd < 7)) {
          ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&next_2->arguments,0);
          pVVar20 = *ppVVar14;
          ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&next_2->arguments,1);
          pVVar17 = getType<VmConstant>(*ppVVar14);
          pVVar18 = getType<VmConstant>(pVVar20);
          if ((pVVar18 == (VmConstant *)0x0) || (pVVar18->container != (VariableData *)0x0)) {
            storePointer = &next_2->prevSibling->super_VmValue;
            while( true ) {
              local_471 = 0;
              if (storePointer != (VmValue *)0x0) {
                bVar6 = anon_unknown.dwarf_aa461::HasMemoryAccess
                                  (*(VmInstructionType *)&storePointer[1]._vptr_VmValue);
                local_471 = bVar6 ^ 0xff;
              }
              if ((local_471 & 1) == 0) break;
              storePointer = *(VmValue **)&storePointer[1].users.count;
            }
            if (((storePointer != (VmValue *)0x0) && (9 < *(int *)&storePointer[1]._vptr_VmValue))
               && (*(int *)&storePointer[1]._vptr_VmValue < 0xf)) {
              ppVVar14 = SmallArray<VmValue_*,_4U>::operator[]
                                   ((SmallArray<VmValue_*,_4U> *)&storePointer[1].typeID,0);
              pVVar4 = *ppVVar14;
              ppVVar14 = SmallArray<VmValue_*,_4U>::operator[]
                                   ((SmallArray<VmValue_*,_4U> *)&storePointer[1].typeID,1);
              pVVar18 = getType<VmConstant>(*ppVVar14);
              ppVVar14 = SmallArray<VmValue_*,_4U>::operator[]
                                   ((SmallArray<VmValue_*,_4U> *)&storePointer[1].typeID,2);
              pVVar5 = *ppVVar14;
              uVar8 = GetAccessSize((VmInstruction *)storePointer);
              uVar9 = GetAccessSize(next_2);
              if (((uVar8 == uVar9) && (pVVar4 == pVVar20)) &&
                 ((pVVar18->iValue == pVVar17->iValue &&
                  ((next_2->super_VmValue).type.size == (pVVar5->type).size)))) {
                bVar6 = VmType::operator!=(&(next_2->super_VmValue).type,&pVVar5->type);
                if (bVar6) {
                  module->currentBlock = (VmBlock *)curr_1;
                  curr_1->parent = (VmBlock *)next_2->prevSibling;
                  type.structType = (TypeBase *)pVVar5;
                  type._0_8_ = (next_2->super_VmValue).type.structType;
                  pVVar20 = anon_unknown.dwarf_aa461::CreateBitcast
                                      ((anon_unknown_dwarf_aa461 *)module,
                                       (VmModule *)(next_2->super_VmValue).source,
                                       *(SynBase **)&(next_2->super_VmValue).type,type,in_R9);
                  curr_1->parent = (VmBlock *)(curr_1->arguments).allocator;
                  module->currentBlock = (VmBlock *)0x0;
                  anon_unknown.dwarf_aa461::ReplaceValueUsersWith
                            (module,&next_2->super_VmValue,pVVar20,&module->loadStorePropagations);
                }
                else {
                  anon_unknown.dwarf_aa461::ReplaceValueUsersWith
                            (module,&next_2->super_VmValue,pVVar5,&module->loadStorePropagations);
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    module->currentFunction = pVVar11;
    next = pVVar11->firstBlock;
    while (next != (VmBlock *)0x0) {
      pVVar2 = next->nextSibling;
      RunLoadStorePropagation(ctx,module,&next->super_VmValue);
      next = pVVar2;
    }
    for (variable._4_4_ = 0; uVar8 = SmallArray<VariableData_*,_4U>::size(&pVVar11->allocas),
        variable._4_4_ < uVar8; variable._4_4_ = variable._4_4_ + 1) {
      ppVVar12 = SmallArray<VariableData_*,_4U>::operator[](&pVVar11->allocas,variable._4_4_);
      pVVar3 = *ppVVar12;
      bVar6 = false;
      for (user._0_4_ = 0; uVar8 = SmallArray<VmConstant_*,_8U>::size(&pVVar3->users),
          (uint)user < uVar8; user._0_4_ = (uint)user + 1) {
        ppVVar13 = SmallArray<VmConstant_*,_8U>::operator[](&pVVar3->users,(uint)user);
        pVVar17 = *ppVVar13;
        for (inst._4_4_ = 0;
            uVar8 = SmallArray<VmValue_*,_8U>::size(&(pVVar17->super_VmValue).users),
            inst._4_4_ < uVar8; inst._4_4_ = inst._4_4_ + 1) {
          ppVVar14 = SmallArray<VmValue_*,_8U>::operator[]
                               (&(pVVar17->super_VmValue).users,inst._4_4_);
          pVVar15 = getType<VmInstruction>(*ppVVar14);
          if (pVVar15 == (VmInstruction *)0x0) {
            __assert_fail("!\"invalid constant use\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x14a8,
                          "void RunLoadStorePropagation(ExpressionContext &, VmModule *, VmValue *)"
                         );
          }
          if (((((int)pVVar15->cmd < 8) || (0xe < (int)pVVar15->cmd)) ||
              (ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,0),
              (VmConstant *)*ppVVar14 != pVVar17)) &&
             ((pVVar15->cmd != VM_INST_MEM_COPY ||
              (ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,0),
              (VmConstant *)*ppVVar14 != pVVar17)))) {
            if ((pVVar15->cmd == VM_INST_MEM_COPY) &&
               (ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,2),
               (VmConstant *)*ppVVar14 == pVVar17)) {
              ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,0);
              deadStores.allocator = (Allocator *)getType<VmConstant>(*ppVVar14);
              if (((VmConstant *)deadStores.allocator != (VmConstant *)0x0) &&
                 (((VmConstant *)deadStores.allocator)->container == pVVar17->container))
              goto LAB_00218bf5;
            }
            if ((pVVar15->cmd != VM_INST_SET_RANGE) ||
               (ppVVar14 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,0),
               (VmConstant *)*ppVVar14 != pVVar17)) {
              bVar6 = true;
              break;
            }
          }
LAB_00218bf5:
        }
        if (bVar6) break;
      }
      if (!bVar6) {
        SmallArray<VmInstruction_*,_32U>::SmallArray
                  ((SmallArray<VmInstruction_*,_32U> *)local_188,module->allocator);
        for (local_18c = 0; uVar8 = local_18c,
            uVar9 = SmallArray<VmConstant_*,_8U>::size(&pVVar3->users), uVar8 < uVar9;
            local_18c = local_18c + 1) {
          ppVVar13 = SmallArray<VmConstant_*,_8U>::operator[](&pVVar3->users,local_18c);
          pVStack_1a8 = *ppVVar13;
          for (inst_1._4_4_ = 0; uVar8 = inst_1._4_4_,
              uVar9 = SmallArray<VmValue_*,_8U>::size(&(pVStack_1a8->super_VmValue).users),
              uVar8 < uVar9; inst_1._4_4_ = inst_1._4_4_ + 1) {
            ppVVar14 = SmallArray<VmValue_*,_8U>::operator[]
                                 (&(pVStack_1a8->super_VmValue).users,inst_1._4_4_);
            pVStack_1b8 = getType<VmInstruction>(*ppVVar14);
            if (pVStack_1b8 != (VmInstruction *)0x0) {
              SmallArray<VmInstruction_*,_32U>::push_back
                        ((SmallArray<VmInstruction_*,_32U> *)local_188,&stack0xfffffffffffffe48);
            }
          }
        }
        for (inst_2._4_4_ = 0; uVar8 = inst_2._4_4_,
            uVar9 = SmallArray<VmInstruction_*,_32U>::size
                              ((SmallArray<VmInstruction_*,_32U> *)local_188), uVar8 < uVar9;
            inst_2._4_4_ = inst_2._4_4_ + 1) {
          ppVVar16 = SmallArray<VmInstruction_*,_32U>::operator[]
                               ((SmallArray<VmInstruction_*,_32U> *)local_188,inst_2._4_4_);
          block = (VmBlock *)*ppVVar16;
          if ((VmBlock *)block->insertPoint != (VmBlock *)0x0) {
            VmBlock::RemoveInstruction((VmBlock *)block->insertPoint,(VmInstruction *)block);
          }
          module->loadStorePropagations = module->loadStorePropagations + 1;
        }
        SmallArray<VmInstruction_*,_32U>::~SmallArray((SmallArray<VmInstruction_*,_32U> *)local_188)
        ;
      }
    }
    module->currentFunction = (VmFunction *)0x0;
  }
  return;
}

Assistant:

void RunLoadStorePropagation(ExpressionContext &ctx, VmModule *module, VmValue *value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		module->currentFunction = function;

		VmBlock *curr = function->firstBlock;

		while(curr)
		{
			VmBlock *next = curr->nextSibling;
			RunLoadStorePropagation(ctx, module, curr);
			curr = next;
		}

		// Remove allocas that are only used by stores
		for(unsigned i = 0; i < function->allocas.size(); i++)
		{
			VariableData *variable = function->allocas[i];

			bool nonStoreUse = false;

			for(unsigned k = 0; k < variable->users.size(); k++)
			{
				VmConstant *user = variable->users[k];

				for(unsigned l = 0; l < user->users.size(); l++)
				{
					if(VmInstruction *inst = getType<VmInstruction>(user->users[l]))
					{
						if(inst->cmd >= VM_INST_STORE_BYTE && inst->cmd <= VM_INST_STORE_STRUCT && inst->arguments[0] == user)
							continue;

						if(inst->cmd == VM_INST_MEM_COPY && inst->arguments[0] == user)
							continue;

						if(inst->cmd == VM_INST_MEM_COPY && inst->arguments[2] == user)
						{
							if(VmConstant *dst = getType<VmConstant>(inst->arguments[0]))
							{
								// Copy to the same container the load is from is a circular use and doesn't count as non-store use
								if(dst->container == user->container)
									continue;
							}
						}

						if(inst->cmd == VM_INST_SET_RANGE && inst->arguments[0] == user)
							continue;

						nonStoreUse = true;
						break;
					}
					else
					{
						assert(!"invalid constant use");
					}
				}

				if(nonStoreUse)
					break;
			}

			if(!nonStoreUse)
			{
				SmallArray<VmInstruction*, 32> deadStores(module->allocator);

				for(unsigned k = 0; k < variable->users.size(); k++)
				{
					VmConstant *user = variable->users[k];

					for(unsigned l = 0; l < user->users.size(); l++)
					{
						if(VmInstruction *inst = getType<VmInstruction>(user->users[l]))
							deadStores.push_back(inst);
					}
				}

				for(unsigned k = 0; k < deadStores.size(); k++)
				{
					VmInstruction *inst = deadStores[k];

					if(inst->parent)
						inst->parent->RemoveInstruction(inst);

					module->loadStorePropagations++;
				}
			}
		}

		module->currentFunction = NULL;
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		// Handle loads and stores to constant global or frame addresses
		ClearLoadStoreInfo(module);

		for(VmInstruction *curr = block->firstInstruction; curr;)
		{
			VmInstruction *next = curr->nextSibling;

			switch(curr->cmd)
			{
			case VM_INST_LOAD_BYTE:
				if(VmValue* prevValue = GetLoadStoreInfo(module, curr))
				{
					if(VmConstant* constant = getType<VmConstant>(prevValue))
					{
						ReplaceValueUsersWith(module, curr, CreateConstantInt(module->allocator, prevValue->source, (int)(char)(constant->iValue)), &module->loadStorePropagations);
						break;
					}
				}

				AddLoadInfo(module, curr);
				break;
			case VM_INST_LOAD_SHORT:
				if(VmValue* prevValue = GetLoadStoreInfo(module, curr))
				{
					if(VmConstant* constant = getType<VmConstant>(prevValue))
					{
						ReplaceValueUsersWith(module, curr, CreateConstantInt(module->allocator, prevValue->source, (int)(short)(constant->iValue)), &module->loadStorePropagations);
						break;
					}
				}

				AddLoadInfo(module, curr);
				break;
			case VM_INST_LOAD_INT:
			case VM_INST_LOAD_FLOAT:
			case VM_INST_LOAD_DOUBLE:
			case VM_INST_LOAD_LONG:
			case VM_INST_LOAD_STRUCT:
				if(VmValue* prevValue = GetLoadStoreInfo(module, curr))
				{
					if(curr->type != prevValue->type)
					{
						assert(curr->type.size == prevValue->type.size);

						module->currentBlock = block;

						block->insertPoint = curr->prevSibling;

						prevValue = CreateBitcast(module, curr->source, curr->type, prevValue);

						block->insertPoint = block->lastInstruction;

						module->currentBlock = NULL;

						ReplaceValueUsersWith(module, curr, prevValue, &module->loadStorePropagations);
					}
					else
					{
						ReplaceValueUsersWith(module, curr, prevValue, &module->loadStorePropagations);
					}

					break;
				}

				AddLoadInfo(module, curr);
				break;
			case VM_INST_STORE_BYTE:
			case VM_INST_STORE_SHORT:
			case VM_INST_STORE_INT:
			case VM_INST_STORE_FLOAT:
			case VM_INST_STORE_DOUBLE:
			case VM_INST_STORE_LONG:
			case VM_INST_STORE_STRUCT:
				AddStoreInfo(module, curr);
				break;
			case VM_INST_MEM_COPY:
				{
					VmValue *address = curr->arguments[2];
					VmConstant *offset = getType<VmConstant>(curr->arguments[3]);

					if(VmInstruction* prevCopy = GetCopyInfo(module, address, offset, GetAccessSize(curr)))
					{
						ChangeInstructionTo(module, curr, curr->cmd, curr->arguments[0], curr->arguments[1], prevCopy->arguments[2], prevCopy->arguments[3], curr->arguments[4], &module->loadStorePropagations);
					}
				}

				AddCopyInfo(module, curr);
				break;
			case VM_INST_SET_RANGE:
				ClearLoadStoreInfoAliasing(module, NULL);
				ClearLoadStoreInfoGlobal(module);
				break;
			case VM_INST_CALL:
				unsigned firstArgument;
				VmFunction *targetFunction;

				if(curr->arguments[0]->type.type == VM_TYPE_FUNCTION_REF)
				{
					firstArgument = 2;

					targetFunction = NULL;
				}
				else
				{
					firstArgument = 3;

					targetFunction = getType<VmFunction>(curr->arguments[1]);
				}

				for(unsigned i = firstArgument; i < curr->arguments.size(); i++)
				{
					if(VmConstant *constant = getType<VmConstant>(curr->arguments[i]))
					{
						if(constant->isReference)
						{
							if(VmInstruction* prevCopy = GetCopyInfo(module, constant, NULL, constant->type.size))
							{
								if(VmConstant *constAddress = getType<VmConstant>(prevCopy->arguments[2]))
								{
									VmConstant *reference = new (module->get<VmConstant>()) VmConstant(ctx.allocator, constant->type, curr->source);

									reference->iValue = constAddress->iValue;
									reference->container = constAddress->container;
									reference->isReference = true;

									reference->container->users.push_back(reference);

									reference->comment = constant->comment;

									reference->AddUse(curr);
									curr->arguments[i]->RemoveUse(curr);

									curr->arguments[i] = reference;
								}
							}
						}
					}
				}

				if(VmConstant *constant = getType<VmConstant>(curr->arguments[firstArgument - 1]))
				{
					if(constant->isReference)
					{
						// Remove previous loads and stores to the address range of the return value
						ClearLoadStoreInfo(module, constant->container, unsigned(constant->iValue), constant->type.size);
					}
				}

				if(targetFunction)
				{
					if((targetFunction->function->attributes & (1 << NULLC_ATTRIBUTE_NO_MEMORY_WRITE)) != 0)
						break;
				}

				ClearLoadStoreInfoAliasing(module, NULL);
				ClearLoadStoreInfoGlobal(module);
				break;
			case VM_INST_RETURN:
				if(!curr->arguments.empty())
				{
					if(VmConstant *constant = getType<VmConstant>(curr->arguments[0]))
					{
						if(constant->isReference)
						{
							if(VmInstruction* prevCopy = GetCopyInfo(module, constant, NULL, constant->type.size))
							{
								if(VmConstant *constAddress = getType<VmConstant>(prevCopy->arguments[2]))
								{
									VmConstant *reference = new (module->get<VmConstant>()) VmConstant(ctx.allocator, constant->type, curr->source);

									reference->iValue = constAddress->iValue;
									reference->container = constAddress->container;
									reference->isReference = true;

									reference->container->users.push_back(reference);

									ChangeInstructionTo(module, curr, curr->cmd, reference, NULL, NULL, NULL, NULL, &module->loadStorePropagations);
								}
							}
						}
					}
				}
				break;
			case VM_INST_ADD_LOAD:
			case VM_INST_SUB_LOAD:
			case VM_INST_MUL_LOAD:
			case VM_INST_DIV_LOAD:
			case VM_INST_POW_LOAD:
			case VM_INST_MOD_LOAD:
			case VM_INST_LESS_LOAD:
			case VM_INST_GREATER_LOAD:
			case VM_INST_LESS_EQUAL_LOAD:
			case VM_INST_GREATER_EQUAL_LOAD:
			case VM_INST_EQUAL_LOAD:
			case VM_INST_NOT_EQUAL_LOAD:
			case VM_INST_SHL_LOAD:
			case VM_INST_SHR_LOAD:
			case VM_INST_BIT_AND_LOAD:
			case VM_INST_BIT_OR_LOAD:
			case VM_INST_BIT_XOR_LOAD:
			{
				VmValue *loadPointer = curr->arguments[1];
				VmConstant *loadOffset = getType<VmConstant>(curr->arguments[2]);
				VmConstant *loadInst = getType<VmConstant>(curr->arguments[3]);

				unsigned loadSize = 0;

				switch(loadInst->iValue)
				{
				case VM_INST_LOAD_INT:
				case VM_INST_LOAD_FLOAT:
					loadSize = 4;
					break;
				case VM_INST_LOAD_DOUBLE:
				case VM_INST_LOAD_LONG:
					loadSize = 8;
					break;
				}

				assert(loadSize);

				unsigned accessSize = GetAccessSize(curr);

				if(VmValue* prevValue = GetLoadStoreInfo(module, loadPointer, loadOffset, loadSize, accessSize, VmInstructionType(loadInst->iValue)))
					ChangeInstructionTo(module, curr, GetOperationWithoutLoad(curr->cmd), curr->arguments[0], prevValue, NULL, NULL, NULL, &module->loadStorePropagations);
			}
				break;
			default:
				break;
			}

			curr = next;
		}

		// Handle consecutive stores to the same address
		for(VmInstruction *curr = block->firstInstruction; curr; curr = curr->nextSibling)
		{
			if(curr->cmd >= VM_INST_STORE_BYTE && curr->cmd <= VM_INST_STORE_STRUCT)
			{
				// Walk up until a memory write is reached
				VmInstruction *prev = curr->prevSibling;

				while(prev && !HasMemoryAccess(prev->cmd))
					prev = prev->prevSibling;

				if(prev && prev->cmd == curr->cmd)
				{
					bool same = false;

					VmConstant *prevAddressAsConst = getType<VmConstant>(prev->arguments[0]);
					VmConstant *prevOffset = getType<VmConstant>(prev->arguments[1]);

					VmConstant *currAddressAsConst = getType<VmConstant>(curr->arguments[0]);
					VmConstant *currOffset = getType<VmConstant>(curr->arguments[1]);

					if(currAddressAsConst && prevAddressAsConst)
						same = *currAddressAsConst == *prevAddressAsConst && prevOffset->iValue == currOffset->iValue;
					else
						same = prev->arguments[0] == curr->arguments[0] && prevOffset->iValue == currOffset->iValue;

					if(same)
					{
						block->RemoveInstruction(prev);

						module->loadStorePropagations++;
					}
				}
			}
		}

		// Handle immediate loads from the same address as a store
		for(VmInstruction *curr = block->firstInstruction; curr;)
		{
			VmInstruction *next = curr->nextSibling;

			if(curr->cmd >= VM_INST_LOAD_INT && curr->cmd <= VM_INST_LOAD_STRUCT)
			{
				VmValue *loadPointer = curr->arguments[0];
				VmConstant *loadOffset = getType<VmConstant>(curr->arguments[1]);

				// Skip reads of direct addresses (usually from null pointer access)
				if(VmConstant *loadAddress = getType<VmConstant>(loadPointer))
				{
					if(!loadAddress->container)
					{
						curr = next;
						continue;
					}
				}

				// Walk up until a memory write is reached
				VmInstruction *prev = curr->prevSibling;

				while(prev && !HasMemoryAccess(prev->cmd))
					prev = prev->prevSibling;

				if(prev && (prev->cmd >= VM_INST_STORE_INT && prev->cmd <= VM_INST_STORE_STRUCT))
				{
					VmValue *storePointer = prev->arguments[0];
					VmConstant *storeOffset = getType<VmConstant>(prev->arguments[1]);
					VmValue *storeValue = prev->arguments[2];

					if(GetAccessSize(prev) == GetAccessSize(curr) && storePointer == loadPointer && storeOffset->iValue == loadOffset->iValue && curr->type.size == storeValue->type.size)
					{
						if(curr->type != storeValue->type)
						{
							module->currentBlock = block;

							block->insertPoint = curr->prevSibling;

							storeValue = CreateBitcast(module, curr->source, curr->type, storeValue);

							block->insertPoint = block->lastInstruction;

							module->currentBlock = NULL;

							ReplaceValueUsersWith(module, curr, storeValue, &module->loadStorePropagations);
						}
						else
						{
							ReplaceValueUsersWith(module, curr, storeValue, &module->loadStorePropagations);
						}
					}
				}
			}

			curr = next;
		}
	}
}